

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

CoherentFlags __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::TranslateCoherent
          (TGlslangToSpvTraverser *this,TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  bool local_22;
  bool local_21;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  CoherentFlags flags;
  
  spv::Builder::AccessChain::CoherentFlags::CoherentFlags((CoherentFlags *)((long)&this_local + 4));
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_2_ =
       this_local._4_2_ & 0xfffe |
       (ushort)((byte)(*(ulong *)(CONCAT44(extraout_var,iVar2) + 8) >> 0x31) & 1);
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_2_ =
       this_local._4_2_ & 0xfffd |
       (ushort)((byte)(*(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) >> 0x34) & 1) << 1;
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_4_ =
       (CoherentFlags)
       CONCAT22(this_local._6_2_,
                this_local._4_2_ & 0xfffb |
                (ushort)((byte)(*(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8) >> 0x35) & 1) << 2);
  iVar2 = (*type->_vptr_TType[0xb])();
  local_21 = true;
  if ((*(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) >> 0x36 & 1) == 0) {
    iVar2 = (*type->_vptr_TType[0xb])();
    local_21 = ((uint)*(undefined8 *)(CONCAT44(extraout_var_03,iVar2) + 8) & 0x7f) == 7;
  }
  this_local._4_2_ = this_local._4_2_ & 0xfff7 | (ushort)local_21 << 3;
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_2_ =
       this_local._4_2_ & 0xffef |
       (ushort)((byte)(*(ulong *)(CONCAT44(extraout_var_04,iVar2) + 8) >> 0x37) & 1) << 4;
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_2_ =
       this_local._4_2_ & 0xffdf |
       (ushort)((byte)((ulong)*(undefined8 *)(CONCAT44(extraout_var_05,iVar2) + 8) >> 0x38) & 1) <<
       5;
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_2_ =
       this_local._4_2_ & 0xff7f |
       (ushort)((byte)(*(ulong *)(CONCAT44(extraout_var_06,iVar2) + 8) >> 0x32) & 1) << 7;
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_4_ =
       (CoherentFlags)
       CONCAT22(this_local._6_2_,
                this_local._4_2_ & 0xfeff |
                (ushort)((byte)(*(ulong *)(CONCAT44(extraout_var_07,iVar2) + 8) >> 0x33) & 1) << 8);
  iVar2 = (*type->_vptr_TType[0xb])();
  local_22 = true;
  if ((*(ulong *)(CONCAT44(extraout_var_08,iVar2) + 8) >> 0x39 & 1) == 0) {
    bVar1 = spv::Builder::AccessChain::CoherentFlags::anyCoherent
                      ((CoherentFlags *)((long)&this_local + 4));
    local_22 = true;
    if (!bVar1) {
      local_22 = (this_local._4_2_ >> 7 & 1) != 0;
    }
  }
  this_local._4_2_ = this_local._4_2_ & 0xffbf | (ushort)local_22 << 6;
  iVar2 = (*type->_vptr_TType[7])();
  this_local._4_2_ = this_local._4_2_ & 0xfdff | (ushort)(iVar2 == 0xe) << 9;
  iVar2 = (*type->_vptr_TType[0xb])();
  this_local._4_4_ =
       (CoherentFlags)
       CONCAT22(this_local._6_2_,
                this_local._4_2_ & 0xfbff |
                (ushort)((byte)(*(ulong *)(CONCAT44(extraout_var_09,iVar2) + 8) >> 0x21) & 1) << 10)
  ;
  return this_local._4_4_;
}

Assistant:

spv::Builder::AccessChain::CoherentFlags TGlslangToSpvTraverser::TranslateCoherent(const glslang::TType& type)
{
    spv::Builder::AccessChain::CoherentFlags flags = {};
    flags.coherent = type.getQualifier().coherent;
    flags.devicecoherent = type.getQualifier().devicecoherent;
    flags.queuefamilycoherent = type.getQualifier().queuefamilycoherent;
    // shared variables are implicitly workgroupcoherent in GLSL.
    flags.workgroupcoherent = type.getQualifier().workgroupcoherent ||
                              type.getQualifier().storage == glslang::EvqShared;
    flags.subgroupcoherent = type.getQualifier().subgroupcoherent;
    flags.shadercallcoherent = type.getQualifier().shadercallcoherent;
    flags.volatil = type.getQualifier().volatil;
    flags.nontemporal = type.getQualifier().nontemporal;
    // *coherent variables are implicitly nonprivate in GLSL
    flags.nonprivate = type.getQualifier().nonprivate ||
                       flags.anyCoherent() ||
                       flags.volatil;
    flags.isImage = type.getBasicType() == glslang::EbtSampler;
    flags.nonUniform = type.getQualifier().nonUniform;
    return flags;
}